

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

void __thiscall
t_dart_generator::generate_dart_struct_reader(t_dart_generator *this,ostream *out,t_struct *tstruct)

{
  t_field *tfield;
  t_struct *ptVar1;
  bool bVar2;
  e_req eVar3;
  ostream *poVar4;
  reference pptVar5;
  t_type *ptVar6;
  string *psVar7;
  string local_328;
  string local_308;
  allocator local_2e1;
  string local_2e0;
  string local_2c0;
  undefined1 local_2a0 [8];
  string field_name;
  string local_270;
  string local_250;
  string local_230;
  allocator local_209;
  string local_208;
  allocator local_1e1;
  string local_1e0;
  allocator local_1b9;
  string local_1b8;
  allocator local_191;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_110
  ;
  t_field **local_108;
  allocator local_f9;
  string local_f8;
  string local_d8;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_68;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  allocator local_41;
  string local_40;
  t_struct *local_20;
  t_struct *tstruct_local;
  ostream *out_local;
  t_dart_generator *this_local;
  
  local_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::operator<<(poVar4,"read(TProtocol iprot)");
  ptVar1 = tstruct_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40," ",&local_41);
  scope_up(this,(ostream *)ptVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  f_iter._M_current = (t_field **)t_struct::get_members(local_20);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_68);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"TField field;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"iprot.readStructBegin();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  std::operator<<(poVar4,"while (true)");
  ptVar1 = tstruct_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88," ",&local_89);
  scope_up(this,(ostream *)ptVar1,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"field = iprot.readFieldBegin();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  std::operator<<(poVar4,"if (field.type == TType.STOP)");
  ptVar1 = tstruct_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0," ",&local_b1);
  scope_up(this,(ostream *)ptVar1,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"break;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  ptVar1 = tstruct_local;
  std::__cxx11::string::string((string *)&local_d8,(string *)&::endl_abi_cxx11_);
  scope_down(this,(ostream *)ptVar1,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  std::operator<<(poVar4,"switch (field.id)");
  ptVar1 = tstruct_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_f8," ",&local_f9);
  scope_up(this,(ostream *)ptVar1,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  local_108 = (t_field **)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  local_68._M_current = local_108;
  while( true ) {
    local_110._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(f_iter._M_current);
    bVar2 = __gnu_cxx::operator!=(&local_68,&local_110);
    if (!bVar2) break;
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar4 = std::operator<<(poVar4,"case ");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_68);
    psVar7 = t_field::get_name_abi_cxx11_(*pptVar5);
    std::__cxx11::string::string((string *)&local_150,(string *)psVar7);
    t_oop_generator::upcase_string(&local_130,&this->super_t_oop_generator,&local_150);
    poVar4 = std::operator<<(poVar4,(string *)&local_130);
    poVar4 = std::operator<<(poVar4,":");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    t_generator::indent_up((t_generator *)this);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar4 = std::operator<<(poVar4,"if (field.type == ");
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_68);
    ptVar6 = t_field::get_type(*pptVar5);
    type_to_enum_abi_cxx11_(&local_170,this,ptVar6);
    poVar4 = std::operator<<(poVar4,(string *)&local_170);
    std::operator<<(poVar4,")");
    std::__cxx11::string::~string((string *)&local_170);
    ptVar1 = tstruct_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_190," ",&local_191);
    scope_up(this,(ostream *)ptVar1,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
    ptVar1 = tstruct_local;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_68);
    tfield = *pptVar5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1b8,"this.",&local_1b9);
    generate_deserialize_field(this,(ostream *)ptVar1,tfield,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    ptVar1 = tstruct_local;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_68);
    generate_isset_set(this,(ostream *)ptVar1,*pptVar5);
    ptVar1 = tstruct_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1e0," else",&local_1e1);
    scope_down(this,(ostream *)ptVar1,&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
    ptVar1 = tstruct_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_208," ",&local_209);
    scope_up(this,(ostream *)ptVar1,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator((allocator<char> *)&local_209);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar4 = std::operator<<(poVar4,"TProtocolUtil.skip(iprot, field.type);");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    ptVar1 = tstruct_local;
    std::__cxx11::string::string((string *)&local_230,(string *)&::endl_abi_cxx11_);
    scope_down(this,(ostream *)ptVar1,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
    poVar4 = std::operator<<(poVar4,"break;");
    std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    t_generator::indent_down((t_generator *)this);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_68);
  }
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"default:");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"TProtocolUtil.skip(iprot, field.type);");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"break;");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tstruct_local;
  std::__cxx11::string::string((string *)&local_250,(string *)&::endl_abi_cxx11_);
  scope_down(this,(ostream *)ptVar1,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"iprot.readFieldEnd();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  ptVar1 = tstruct_local;
  std::__cxx11::string::string((string *)&local_270,(string *)&::endl_abi_cxx11_);
  scope_down(this,(ostream *)ptVar1,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"iprot.readStructEnd();");
  std::operator<<(poVar4,(string *)&endl2_abi_cxx11_);
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,
                           "// check for required fields of primitive type, which can\'t be checked in the validate method"
                          );
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  local_68._M_current =
       (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(f_iter._M_current);
  while( true ) {
    field_name.field_2._8_8_ =
         std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                   ((vector<t_field_*,_std::allocator<t_field_*>_> *)f_iter._M_current);
    bVar2 = __gnu_cxx::operator!=
                      (&local_68,
                       (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                        *)((long)&field_name.field_2 + 8));
    if (!bVar2) break;
    pptVar5 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_68);
    eVar3 = t_field::get_req(*pptVar5);
    if (eVar3 == T_REQUIRED) {
      pptVar5 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_68);
      ptVar6 = t_field::get_type(*pptVar5);
      bVar2 = type_can_be_null(this,ptVar6);
      if (!bVar2) {
        pptVar5 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&local_68);
        psVar7 = t_field::get_name_abi_cxx11_(*pptVar5);
        std::__cxx11::string::string((string *)&local_2c0,(string *)psVar7);
        get_member_name((string *)local_2a0,this,&local_2c0);
        std::__cxx11::string::~string((string *)&local_2c0);
        poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
        poVar4 = std::operator<<(poVar4,"if (!__isset_");
        poVar4 = std::operator<<(poVar4,(string *)local_2a0);
        std::operator<<(poVar4,")");
        ptVar1 = tstruct_local;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_2e0," ",&local_2e1);
        scope_up(this,(ostream *)ptVar1,&local_2e0);
        std::__cxx11::string::~string((string *)&local_2e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
        poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
        poVar4 = std::operator<<(poVar4,
                                 "  throw new TProtocolError(TProtocolErrorType.UNKNOWN, \"Required field \'"
                                );
        poVar4 = std::operator<<(poVar4,(string *)local_2a0);
        poVar4 = std::operator<<(poVar4,
                                 "\' was not found in serialized data! Struct: \" + toString());");
        std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
        ptVar1 = tstruct_local;
        std::__cxx11::string::string((string *)&local_308,(string *)&endl2_abi_cxx11_);
        scope_down(this,(ostream *)ptVar1,&local_308);
        std::__cxx11::string::~string((string *)&local_308);
        std::__cxx11::string::~string((string *)local_2a0);
      }
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_68);
  }
  poVar4 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar4 = std::operator<<(poVar4,"validate();");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  ptVar1 = tstruct_local;
  std::__cxx11::string::string((string *)&local_328,(string *)&endl2_abi_cxx11_);
  scope_down(this,(ostream *)ptVar1,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  return;
}

Assistant:

void t_dart_generator::generate_dart_struct_reader(ostream& out, t_struct* tstruct) {
  indent(out) << "read(TProtocol iprot)";
  scope_up(out);

  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  // Declare stack tmp variables and read struct header
  indent(out) << "TField field;" << endl;
  indent(out) << "iprot.readStructBegin();" << endl;

  // Loop over reading in fields
  indent(out) << "while (true)";
  scope_up(out);

  // Read beginning field marker
  indent(out) << "field = iprot.readFieldBegin();" << endl;

  // Check for field STOP marker and break
  indent(out) << "if (field.type == TType.STOP)";
  scope_up(out);
  indent(out) << "break;" << endl;
  scope_down(out);

  // Switch statement on the field we are reading
  indent(out) << "switch (field.id)";
  scope_up(out);

  // Generate deserialization code for known cases
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    indent(out) << "case " << upcase_string((*f_iter)->get_name()) << ":" << endl;
    indent_up();

    indent(out) << "if (field.type == " << type_to_enum((*f_iter)->get_type()) << ")";
    scope_up(out);

    generate_deserialize_field(out, *f_iter, "this.");
    generate_isset_set(out, *f_iter);

    scope_down(out, " else");
    scope_up(out);
    indent(out) << "TProtocolUtil.skip(iprot, field.type);" << endl;
    scope_down(out);

    indent(out) << "break;" << endl;
    indent_down();
  }

  // In the default case we skip the field
  indent(out) << "default:" << endl;
  indent_up();
  indent(out) << "TProtocolUtil.skip(iprot, field.type);" << endl;
  indent(out) << "break;" << endl;
  indent_down();

  scope_down(out);

  // Read field end marker
  indent(out) << "iprot.readFieldEnd();" << endl;

  scope_down(out);

  indent(out) << "iprot.readStructEnd();" << endl2;

  // in non-beans style, check for required fields of primitive type
  // (which can be checked here but not in the general validate method)
  indent(out) << "// check for required fields of primitive type, which can't be "
                 "checked in the validate method" << endl;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if ((*f_iter)->get_req() == t_field::T_REQUIRED && !type_can_be_null((*f_iter)->get_type())) {
      string field_name = get_member_name((*f_iter)->get_name());
      indent(out) << "if (!__isset_" << field_name << ")";
      scope_up(out);
      indent(out) << "  throw new TProtocolError(TProtocolErrorType.UNKNOWN, \"Required field '"
          << field_name
          << "' was not found in serialized data! Struct: \" + toString());" << endl;
      scope_down(out, endl2);
    }
  }

  // performs various checks (e.g. check that all required fields are set)
  indent(out) << "validate();" << endl;

  scope_down(out, endl2);
}